

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall xray_re::se_stalker::state_read(se_stalker *this)

{
  uint16_t in_DX;
  xr_packet *in_RSI;
  
  state_read((se_stalker *)
             &this[-1].super_cse_alife_human_stalker.super_cse_alife_human_abstract.
              super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x38,in_RSI,
             in_DX);
  return;
}

Assistant:

void se_stalker::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_human_stalker::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);
		packet.r_sz(m_old_lvid);
		packet.r_sz(m_active_section);
		packet.r_bool(m_death_dropped);
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		packet.r_u8(m_job_online);
		if (m_job_online > 2)
			packet.skip_sz();
		packet.r_bool(m_death_dropped);
		if (m_script_version >= 7)
			packet.r_sz(m_squad_id);
		if (m_script_version >= 8)
			packet.r_bool(m_sim_forced_online);
	} else if (m_version == CSE_VERSION_SOC) {
		if (m_script_version >= 3) {
			packet.r_u8(m_job_online);
			if (m_job_online > 2)
				packet.skip_sz();
		}
		if (m_script_version >= 5)
			packet.r_bool(m_was_in_smart_terrain);
		if (m_script_version >= 6)
			packet.r_bool(m_death_dropped);
	} else if (m_version == CSE_VERSION_2232) {
		if (m_script_version >= 3)
			packet.r_u8(m_job_online);
	} else if (m_version == CSE_VERSION_2571) {
		if (m_script_version >= 3) {
			packet.r_u8(m_job_online);
		}	
	} else if (m_version == CSE_VERSION_2215) {
		if (m_script_version >= 2)
			packet.r_bool(m_was_in_smart_terrain);
	} else {
		xr_not_implemented();
	}
}